

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

QString * __thiscall QHostAddress::toString(QHostAddress *this)

{
  long lVar1;
  bool bVar2;
  quint32 qVar3;
  QHostAddressPrivate *pQVar4;
  QHostAddress *in_RSI;
  QStringBuilder<char16_t,_QString_&> *in_RDI;
  long in_FS_OFFSET;
  quint32 i;
  QString *s;
  QString *in_stack_ffffffffffffffa8;
  QStringBuilder<char16_t,_QString_&> *a;
  undefined4 in_stack_ffffffffffffffc8;
  uint3 in_stack_ffffffffffffffcc;
  uint uVar5;
  QStringBuilder<char16_t,_QString_&> *b;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffffcc;
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  in_RDI->b = (QString *)0xaaaaaaaaaaaaaaaa;
  *(qsizetype *)(in_RDI + 1) = -0x5555555555555556;
  a = in_RDI;
  b = in_RDI;
  QString::QString((QString *)0x217211);
  pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x21721b);
  if ((pQVar4->protocol == '\0') ||
     (pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x21722e),
     pQVar4->protocol == '\x02')) {
    qVar3 = toIPv4Address(in_RSI,(bool *)CONCAT44(uVar5,in_stack_ffffffffffffffc8));
    QIPAddressUtils::toString((QString *)a,qVar3);
  }
  else {
    pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217266);
    if (pQVar4->protocol == '\x01') {
      pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217279);
      QIPAddressUtils::toString((QString *)a,(uchar *)&pQVar4->field_1);
      QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217294);
      bVar2 = QString::isEmpty((QString *)0x2172a0);
      if (!bVar2) {
        uVar6 = 0x25;
        QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                  ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2172b5);
        ::operator+(&a->a,in_stack_ffffffffffffffa8);
        ::operator+=((QString *)CONCAT26(uVar6,in_stack_ffffffffffffffe0),b);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QHostAddress::toString() const
{
    QString s;
    if (d->protocol == QHostAddress::IPv4Protocol
        || d->protocol == QHostAddress::AnyIPProtocol) {
        quint32 i = toIPv4Address();
        QIPAddressUtils::toString(s, i);
    } else if (d->protocol == QHostAddress::IPv6Protocol) {
        QIPAddressUtils::toString(s, d->a6.c);
        if (!d->scopeId.isEmpty())
            s += u'%' + d->scopeId;
    }
    return s;
}